

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O2

int TrellisQuantizeBlock
              (VP8Encoder *enc,int16_t *in,int16_t *out,int ctx0,int coeff_type,VP8Matrix *mtx,
              int lambda)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uint16_t *puVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  long *plVar8;
  ulong uVar9;
  ushort uVar10;
  ushort uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long *plVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  bool bVar26;
  ScoreState score_states [2] [2];
  Node nodes [16] [2];
  int local_19c;
  long local_198;
  uint local_184;
  long *local_160;
  char *local_140;
  long local_100 [9];
  char acStack_b8 [2];
  ushort auStack_b6 [67];
  
  bVar26 = coeff_type == 0;
  uVar9 = (ulong)bVar26;
  bVar1 = (enc->proba).coeffs[(uint)coeff_type][""[uVar9]][ctx0][0];
  uVar22 = 0xf;
  while ((uVar6 = -(uint)!bVar26, (int)(uint)bVar26 <= (int)uVar22 &&
         (uVar6 = uVar22,
         (uint)((int)in[""[uVar22]] * (int)in[""[uVar22]]) <= (uint)mtx->q[1] * (uint)mtx->q[1] >> 2
         ))) {
    uVar22 = uVar22 - 1;
  }
  uVar11 = VP8EntropyCost[bVar1];
  lVar15 = (long)lambda;
  puVar4 = (enc->proba).remapped_costs[(uint)coeff_type][uVar9][ctx0];
  for (lVar20 = 8; lVar20 != 0x28; lVar20 = lVar20 + 0x10) {
    if (ctx0 == 0) {
      uVar19 = (ulong)VP8EntropyCost[(byte)~bVar1];
    }
    else {
      uVar19 = 0;
    }
    *(ulong *)((long)local_100 + lVar20) = uVar19 * lVar15;
    *(uint16_t **)((long)local_100 + lVar20 + 8) = puVar4;
  }
  local_198 = (ulong)uVar11 * lVar15;
  local_140 = acStack_b8 + uVar9 * 8 + 2;
  local_19c = -1;
  local_184 = 0xffffffff;
  cVar5 = -1;
  plVar8 = local_100 + 5;
  local_160 = local_100 + 1;
  while (plVar16 = plVar8, (long)uVar9 <= (long)(int)(uVar6 + ((int)uVar6 < 0xf))) {
    bVar1 = ""[uVar9];
    uVar19 = (ulong)((uint)bVar1 * 2);
    uVar11 = *(ushort *)((long)mtx->q + uVar19);
    uVar3 = *(ushort *)((long)in + uVar19);
    uVar10 = -uVar3;
    if (0 < (short)uVar3) {
      uVar10 = uVar3;
    }
    iVar7 = (uint)*(ushort *)((long)mtx->sharpen + uVar19) + (uint)uVar10;
    uVar22 = (uint)*(ushort *)((long)mtx->iq + uVar19) * iVar7;
    uVar18 = uVar22 >> 0x11;
    uVar19 = (ulong)uVar18;
    uVar22 = uVar22 + 0x10000 >> 0x11;
    if (0x7fe < uVar22) {
      uVar22 = 0x7ff;
    }
    uVar23 = 0x7ff;
    if (uVar18 < 0x7ff) {
      uVar23 = uVar18;
    }
    bVar2 = ""[uVar9 + 1];
    iVar7 = uVar23 * uVar11 + iVar7 * -2;
    if (0x7fe < uVar19) {
      uVar19 = 0x7ff;
    }
    iVar21 = (uint)uVar11 * (int)uVar19;
    plVar8 = plVar16;
    for (lVar20 = 0; lVar20 != 2; lVar20 = lVar20 + 1) {
      uVar24 = uVar19 + lVar20;
      uVar17 = 2;
      if ((uint)uVar24 < 2) {
        uVar17 = uVar24 & 0xffffffff;
      }
      plVar8[1] = (long)(enc->proba).remapped_costs[(uint)coeff_type][uVar9 + 1][uVar17];
      if (uVar22 < uVar24) {
        *plVar8 = 0x7fffffffffffff;
      }
      else {
        uVar12 = 0x43;
        if ((int)(uint)uVar24 < 0x43) {
          uVar12 = uVar24 & 0xffffffff;
        }
        uVar18 = (uint)*(ushort *)
                        ((long)VP8LevelFixedCosts + lVar20 * 2 + (ulong)(uint)((int)uVar19 * 2));
        lVar25 = (ulong)(*(ushort *)(local_160[1] + uVar12 * 2) + uVar18) * lVar15 + *local_160;
        lVar13 = (ulong)(*(ushort *)(local_160[3] + uVar12 * 2) + uVar18) * lVar15 + local_160[2];
        uVar10 = kWeightTrellis[bVar1];
        lVar14 = lVar13;
        if (lVar25 <= lVar13) {
          lVar14 = lVar25;
        }
        local_140[lVar20 * 4 + -2] = lVar13 < lVar25;
        lVar14 = lVar14 + (long)(int)((uint)uVar10 * iVar7 * iVar21) * 0x100;
        local_140[lVar20 * 4 + -1] = (byte)(uVar3 >> 0xf);
        *(short *)(local_140 + lVar20 * 4) = (short)uVar19 + (short)lVar20;
        *plVar8 = lVar14;
        if ((uVar24 != 0) && (lVar14 < local_198)) {
          if (uVar9 < 0xf) {
            uVar17 = (ulong)VP8EntropyCost[(enc->proba).coeffs[(uint)coeff_type][bVar2][uVar17][0]];
          }
          else {
            uVar17 = 0;
          }
          lVar14 = uVar17 * lVar15 + lVar14;
          if (lVar14 < local_198) {
            local_184 = (uint)uVar9;
            local_19c = (int)lVar20;
            local_198 = lVar14;
            cVar5 = lVar13 < lVar25;
          }
        }
      }
      iVar7 = iVar7 + (uint)uVar11;
      iVar21 = iVar21 + (uint)uVar11;
      plVar8 = plVar8 + 2;
    }
    local_140 = local_140 + 8;
    plVar8 = local_160;
    uVar9 = uVar9 + 1;
    local_160 = plVar16;
  }
  if (coeff_type == 0) {
    in[8] = 0;
    in[9] = 0;
    in[10] = 0;
    in[0xb] = 0;
    in[0xc] = 0;
    in[0xd] = 0;
    in[0xe] = 0;
    in[0xf] = 0;
    in[1] = 0;
    in[2] = 0;
    in[3] = 0;
    in[4] = 0;
    in[5] = 0;
    in[6] = 0;
    in[7] = 0;
    in[8] = 0;
    out[8] = 0;
    out[9] = 0;
    out[10] = 0;
    out[0xb] = 0;
    out[0xc] = 0;
    out[0xd] = 0;
    out[0xe] = 0;
    out[0xf] = 0;
    out[1] = 0;
    out[2] = 0;
    out[3] = 0;
    out[4] = 0;
    out[5] = 0;
    out[6] = 0;
    out[7] = 0;
    out[8] = 0;
  }
  else {
    in[8] = 0;
    in[9] = 0;
    in[10] = 0;
    in[0xb] = 0;
    in[0xc] = 0;
    in[0xd] = 0;
    in[0xe] = 0;
    in[0xf] = 0;
    in[0] = 0;
    in[1] = 0;
    in[2] = 0;
    in[3] = 0;
    in[4] = 0;
    in[5] = 0;
    in[6] = 0;
    in[7] = 0;
    out[8] = 0;
    out[9] = 0;
    out[10] = 0;
    out[0xb] = 0;
    out[0xc] = 0;
    out[0xd] = 0;
    out[0xe] = 0;
    out[0xf] = 0;
    out[0] = 0;
    out[1] = 0;
    out[2] = 0;
    out[3] = 0;
    out[4] = 0;
    out[5] = 0;
    out[6] = 0;
    out[7] = 0;
  }
  if (local_184 == 0xffffffff) {
    uVar22 = 0;
  }
  else {
    acStack_b8[(long)local_19c * 4 + (long)(int)local_184 * 8] = cVar5;
    uVar11 = 0;
    for (; (int)(uint)bVar26 <= (int)local_184; local_184 = local_184 - 1) {
      uVar9 = (ulong)local_184;
      lVar20 = (long)local_19c;
      lVar15 = uVar9 * 8;
      bVar1 = ""[uVar9];
      uVar3 = *(ushort *)(acStack_b8 + lVar20 * 4 + lVar15 + 2);
      uVar10 = -uVar3;
      if (acStack_b8[lVar20 * 4 + lVar15 + 1] == '\0') {
        uVar10 = uVar3;
      }
      out[uVar9] = uVar10;
      uVar11 = uVar11 | uVar3;
      *(ushort *)((long)in + (ulong)((uint)bVar1 * 2)) =
           uVar10 * *(short *)((long)mtx->q + (ulong)((uint)bVar1 * 2));
      local_19c = (int)acStack_b8[lVar20 * 4 + lVar15];
    }
    uVar22 = (uint)(uVar11 != 0);
  }
  return uVar22;
}

Assistant:

static int TrellisQuantizeBlock(const VP8Encoder* WEBP_RESTRICT const enc,
                                int16_t in[16], int16_t out[16],
                                int ctx0, int coeff_type,
                                const VP8Matrix* WEBP_RESTRICT const mtx,
                                int lambda) {
  const ProbaArray* const probas = enc->proba.coeffs[coeff_type];
  CostArrayPtr const costs =
      (CostArrayPtr)enc->proba.remapped_costs[coeff_type];
  const int first = (coeff_type == TYPE_I16_AC) ? 1 : 0;
  Node nodes[16][NUM_NODES];
  ScoreState score_states[2][NUM_NODES];
  ScoreState* ss_cur = &SCORE_STATE(0, MIN_DELTA);
  ScoreState* ss_prev = &SCORE_STATE(1, MIN_DELTA);
  int best_path[3] = {-1, -1, -1};   // store best-last/best-level/best-previous
  score_t best_score;
  int n, m, p, last;

  {
    score_t cost;
    const int thresh = mtx->q[1] * mtx->q[1] / 4;
    const int last_proba = probas[VP8EncBands[first]][ctx0][0];

    // compute the position of the last interesting coefficient
    last = first - 1;
    for (n = 15; n >= first; --n) {
      const int j = kZigzag[n];
      const int err = in[j] * in[j];
      if (err > thresh) {
        last = n;
        break;
      }
    }
    // we don't need to go inspect up to n = 16 coeffs. We can just go up
    // to last + 1 (inclusive) without losing much.
    if (last < 15) ++last;

    // compute 'skip' score. This is the max score one can do.
    cost = VP8BitCost(0, last_proba);
    best_score = RDScoreTrellis(lambda, cost, 0);

    // initialize source node.
    for (m = -MIN_DELTA; m <= MAX_DELTA; ++m) {
      const score_t rate = (ctx0 == 0) ? VP8BitCost(1, last_proba) : 0;
      ss_cur[m].score = RDScoreTrellis(lambda, rate, 0);
      ss_cur[m].costs = costs[first][ctx0];
    }
  }

  // traverse trellis.
  for (n = first; n <= last; ++n) {
    const int j = kZigzag[n];
    const uint32_t Q  = mtx->q[j];
    const uint32_t iQ = mtx->iq[j];
    const uint32_t B = BIAS(0x00);     // neutral bias
    // note: it's important to take sign of the _original_ coeff,
    // so we don't have to consider level < 0 afterward.
    const int sign = (in[j] < 0);
    const uint32_t coeff0 = (sign ? -in[j] : in[j]) + mtx->sharpen[j];
    int level0 = QUANTDIV(coeff0, iQ, B);
    int thresh_level = QUANTDIV(coeff0, iQ, BIAS(0x80));
    if (thresh_level > MAX_LEVEL) thresh_level = MAX_LEVEL;
    if (level0 > MAX_LEVEL) level0 = MAX_LEVEL;

    {   // Swap current and previous score states
      ScoreState* const tmp = ss_cur;
      ss_cur = ss_prev;
      ss_prev = tmp;
    }

    // test all alternate level values around level0.
    for (m = -MIN_DELTA; m <= MAX_DELTA; ++m) {
      Node* const cur = &NODE(n, m);
      const int level = level0 + m;
      const int ctx = (level > 2) ? 2 : level;
      const int band = VP8EncBands[n + 1];
      score_t base_score;
      score_t best_cur_score;
      int best_prev;
      score_t cost, score;

      ss_cur[m].costs = costs[n + 1][ctx];
      if (level < 0 || level > thresh_level) {
        ss_cur[m].score = MAX_COST;
        // Node is dead.
        continue;
      }

      {
        // Compute delta_error = how much coding this level will
        // subtract to max_error as distortion.
        // Here, distortion = sum of (|coeff_i| - level_i * Q_i)^2
        const int new_error = coeff0 - level * Q;
        const int delta_error =
            kWeightTrellis[j] * (new_error * new_error - coeff0 * coeff0);
        base_score = RDScoreTrellis(lambda, 0, delta_error);
      }

      // Inspect all possible non-dead predecessors. Retain only the best one.
      // The base_score is added to all scores so it is only added for the final
      // value after the loop.
      cost = VP8LevelCost(ss_prev[-MIN_DELTA].costs, level);
      best_cur_score =
          ss_prev[-MIN_DELTA].score + RDScoreTrellis(lambda, cost, 0);
      best_prev = -MIN_DELTA;
      for (p = -MIN_DELTA + 1; p <= MAX_DELTA; ++p) {
        // Dead nodes (with ss_prev[p].score >= MAX_COST) are automatically
        // eliminated since their score can't be better than the current best.
        cost = VP8LevelCost(ss_prev[p].costs, level);
        // Examine node assuming it's a non-terminal one.
        score = ss_prev[p].score + RDScoreTrellis(lambda, cost, 0);
        if (score < best_cur_score) {
          best_cur_score = score;
          best_prev = p;
        }
      }
      best_cur_score += base_score;
      // Store best finding in current node.
      cur->sign = sign;
      cur->level = level;
      cur->prev = best_prev;
      ss_cur[m].score = best_cur_score;

      // Now, record best terminal node (and thus best entry in the graph).
      if (level != 0 && best_cur_score < best_score) {
        const score_t last_pos_cost =
            (n < 15) ? VP8BitCost(0, probas[band][ctx][0]) : 0;
        const score_t last_pos_score = RDScoreTrellis(lambda, last_pos_cost, 0);
        score = best_cur_score + last_pos_score;
        if (score < best_score) {
          best_score = score;
          best_path[0] = n;                     // best eob position
          best_path[1] = m;                     // best node index
          best_path[2] = best_prev;             // best predecessor
        }
      }
    }
  }

  // Fresh start
  // Beware! We must preserve in[0]/out[0] value for TYPE_I16_AC case.
  if (coeff_type == TYPE_I16_AC) {
    memset(in + 1, 0, 15 * sizeof(*in));
    memset(out + 1, 0, 15 * sizeof(*out));
  } else {
    memset(in, 0, 16 * sizeof(*in));
    memset(out, 0, 16 * sizeof(*out));
  }
  if (best_path[0] == -1) {
    return 0;  // skip!
  }

  {
    // Unwind the best path.
    // Note: best-prev on terminal node is not necessarily equal to the
    // best_prev for non-terminal. So we patch best_path[2] in.
    int nz = 0;
    int best_node = best_path[1];
    n = best_path[0];
    NODE(n, best_node).prev = best_path[2];   // force best-prev for terminal

    for (; n >= first; --n) {
      const Node* const node = &NODE(n, best_node);
      const int j = kZigzag[n];
      out[n] = node->sign ? -node->level : node->level;
      nz |= node->level;
      in[j] = out[n] * mtx->q[j];
      best_node = node->prev;
    }
    return (nz != 0);
  }
}